

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void * consumer_fun(void *params)

{
  vector<Object_*,_std::allocator<Object_*>_> *__x;
  size_type sVar1;
  int local_44;
  undefined1 local_40 [4];
  int i;
  vector<Object_*,_std::allocator<Object_*>_> objs;
  Bucket *bucket;
  int index;
  uint64_t *num;
  void *params_local;
  
  do {
    objs.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)FastQueue::dequeue(fastqueue);
    __x = Bucket::getObjs((Bucket *)
                          objs.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    std::vector<Object_*,_std::allocator<Object_*>_>::vector
              ((vector<Object_*,_std::allocator<Object_*>_> *)local_40,__x);
    local_44 = 0;
    while( true ) {
      sVar1 = std::vector<Object_*,_std::allocator<Object_*>_>::size
                        ((vector<Object_*,_std::allocator<Object_*>_> *)local_40);
      if (sVar1 <= (ulong)(long)local_44) break;
      *(long *)params = *params + 1;
      local_44 = local_44 + 1;
    }
    Bucket::releaseBucket
              ((Bucket *)
               objs.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage);
    std::vector<Object_*,_std::allocator<Object_*>_>::~vector
              ((vector<Object_*,_std::allocator<Object_*>_> *)local_40);
  } while( true );
}

Assistant:

void* consumer_fun(void* params){
    uint64_t* num = (uint64_t*)params;
    int index = 0;
    Bucket* bucket;

    while(true){
       
        bucket = fastqueue->dequeue();
        std::vector<Object*> objs = bucket->getObjs();
        //std::cout<< objs.size() << std::endl;
        for(int i = 0; i < objs.size(); ++i){
            (*num)++;
        }
        bucket->releaseBucket();    
   }
 
   
}